

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

void conf_copy_into(Conf *newconf,Conf *oldconf)

{
  key *from;
  key *to;
  int local_2c;
  int i;
  conf_entry *entry2;
  conf_entry *entry;
  Conf *oldconf_local;
  Conf *newconf_local;
  
  conf_clear(newconf);
  local_2c = 0;
  while( true ) {
    from = (key *)index234(oldconf->tree,local_2c);
    if (from == (key *)0x0) break;
    to = (key *)safemalloc(1,0x18,0);
    copy_key(to,from);
    copy_value((value *)(to + 1),(value *)(from + 1),valuetypes[from->primary]);
    add234(newconf->tree,to);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void conf_copy_into(Conf *newconf, Conf *oldconf)
{
    struct conf_entry *entry, *entry2;
    int i;

    conf_clear(newconf);

    for (i = 0; (entry = index234(oldconf->tree, i)) != NULL; i++) {
        entry2 = snew(struct conf_entry);
        copy_key(&entry2->key, &entry->key);
        copy_value(&entry2->value, &entry->value,
                   valuetypes[entry->key.primary]);
        add234(newconf->tree, entry2);
    }
}